

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleline.h
# Opt level: O2

void __thiscall bandit::reporter::singleline::print_status_line(singleline *this)

{
  ostream *poVar1;
  string asStack_58 [32];
  string local_38 [32];
  
  std::operator<<((this->super_colored_base).stm_,'\r');
  poVar1 = std::operator<<((this->super_colored_base).stm_,"Executed ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar1,(this->super_colored_base).super_progress_base.specs_run_);
  std::operator<<(poVar1," tests.");
  if ((this->super_colored_base).super_progress_base.specs_failed_ != 0) {
    poVar1 = std::operator<<((this->super_colored_base).stm_," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar1,
                        (this->super_colored_base).super_progress_base.specs_succeeded_);
    poVar1 = std::operator<<(poVar1," succeeded. ");
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(local_38);
    poVar1 = std::operator<<(poVar1,local_38);
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar1,
                        (this->super_colored_base).super_progress_base.specs_failed_);
    poVar1 = std::operator<<(poVar1," failed.");
    (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(asStack_58);
    std::operator<<(poVar1,asStack_58);
    std::__cxx11::string::~string(asStack_58);
    std::__cxx11::string::~string(local_38);
  }
  std::ostream::flush();
  return;
}

Assistant:

void print_status_line() {
        stm_ << '\r';
        stm_ << "Executed " << specs_run_ << " tests.";

        if (specs_failed_) {
          stm_
              << " " << specs_succeeded_ << " succeeded. "
              << colorizer_.bad() << specs_failed_ << " failed."
              << colorizer_.reset();
        }
        stm_.flush();
      }